

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall pbrt::CameraHandle::PDF_We(CameraHandle *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  ulong uVar1;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  if (2 < (ushort)(uVar1 >> 0x30)) {
    if ((uVar1 & 0xfffe000000000000) == 0x2000000000000) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.h"
               ,0x184,"PDF_We() unimplemented for SphericalCamera");
    }
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.h"
             ,0x1b5,"PDF_We() unimplemented for RealisticCamera");
  }
  if ((uVar1 & 0x3000000000000) != 0x2000000000000) {
    PerspectiveCamera::PDF_We((PerspectiveCamera *)(uVar1 & 0xffffffffffff),ray,pdfPos,pdfDir);
    return;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.h"
           ,0x10c,"PDF_We() unimplemented for OrthographicCamera");
}

Assistant:

void CameraHandle::PDF_We(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    auto pdf = [&](auto ptr) { return ptr->PDF_We(ray, pdfPos, pdfDir); };
    return Dispatch(pdf);
}